

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix4.cpp
# Opt level: O3

Matrix4 * __thiscall COLLADABU::Math::Matrix4::adjoint(Matrix4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  Matrix4 *in_RDI;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dStack_170;
  double dStack_120;
  
  dVar1 = (this->field_1).m[1][1];
  dVar2 = (this->field_1).m[3][3];
  dVar3 = (this->field_1).m[3][2];
  dVar4 = (this->field_1).m[1][2];
  dVar5 = (this->field_1).m[3][1];
  dVar6 = (this->field_1).m[1][3];
  dVar7 = (this->field_1).m[0][0];
  dVar8 = (this->field_1).m[0][1];
  dVar9 = (this->field_1).m[0][2];
  dVar10 = (this->field_1).m[0][3];
  dVar25 = dVar1 * dVar2 - dVar6 * dVar5;
  dVar27 = dVar1 * dVar3 - dVar4 * dVar5;
  dVar11 = (this->field_1).m[1][0];
  dVar21 = (this->field_1).m[3][0];
  in_RDI->mState = UNKNOWN;
  auVar12 = *(undefined1 (*) [16])((long)&this->field_1 + 0x50);
  dVar34 = auVar12._0_8_;
  dVar35 = auVar12._8_8_;
  auVar13._8_4_ = auVar12._8_4_;
  auVar13._0_8_ = dVar6;
  auVar13._12_4_ = auVar12._12_4_;
  dVar17 = dVar4 * dVar35 - dVar6 * dVar34;
  dVar20 = dVar2 * dVar34 - dVar35 * dVar3;
  dVar18 = dVar4 * dVar2 + -dVar3 * dVar6;
  dVar19 = -dVar9;
  (in_RDI->field_1).m[0][2] = dVar10 * dVar27 + dVar8 * dVar18 + dVar25 * dVar19;
  dVar30 = (this->field_1).m[2][0];
  dVar29 = (this->field_1).m[2][1];
  dVar22 = dVar29 * dVar2 - dVar35 * dVar5;
  dVar26 = dVar29 * dVar3 - dVar34 * dVar5;
  dStack_170 = auVar13._8_8_;
  dVar23 = dVar35 * dVar1 - dVar6 * dVar29;
  dVar24 = dVar2 * dVar30 - dStack_170 * dVar21;
  dVar16 = dVar8 * dVar17 - dVar9 * dVar23;
  dVar28 = dVar11 * dVar20 - dVar4 * dVar24;
  auVar14._8_4_ = SUB84(dVar28,0);
  auVar14._0_8_ = dVar16;
  auVar14._12_4_ = (int)((ulong)dVar28 >> 0x20);
  dVar31 = dVar1 * dVar34 - dVar29 * dVar4;
  dVar32 = dVar30 * dVar3 - dVar21 * dVar34;
  dVar34 = dVar34 * dVar11 - dVar4 * dVar30;
  dVar21 = -dVar21;
  dVar28 = dVar11 * dVar29 + -dVar30 * dVar1;
  dVar29 = dVar5 * dVar30 + dVar21 * dVar29;
  dVar33 = dVar5 * dVar11 + dVar1 * dVar21;
  dVar5 = dVar10 * dVar28;
  auVar12._8_4_ = SUB84(dVar4 * dVar29,0);
  auVar12._0_8_ = dVar5;
  auVar12._12_4_ = (int)((ulong)(dVar4 * dVar29) >> 0x20);
  dStack_170 = auVar14._8_8_;
  dVar2 = dVar2 * dVar11 + dVar6 * dVar21;
  dVar3 = dVar3 * dVar11 + dVar4 * dVar21;
  dVar21 = dVar35 * dVar11 - dVar6 * dVar30;
  dVar30 = -dVar8;
  dStack_120 = auVar12._8_8_;
  dStack_120 = dStack_120 + (dVar26 * dVar11 - dVar32 * dVar1);
  (in_RDI->field_1).m[0][0] = dVar6 * dVar26 + dVar1 * dVar20 + -dVar4 * dVar22;
  (in_RDI->field_1).m[0][1] = -(dVar10 * dVar26 + dVar8 * dVar20 + dVar22 * dVar19);
  (in_RDI->field_1).m[0][3] = -(dVar10 * dVar31 + dVar16);
  (in_RDI->field_1).m[1][0] = -(dVar6 * dVar32 + dStack_170);
  (in_RDI->field_1).m[1][1] = dVar10 * dVar32 + dVar20 * dVar7 + dVar24 * dVar19;
  (in_RDI->field_1).m[1][2] = -(dVar10 * dVar3 + dVar18 * dVar7 + dVar2 * dVar19);
  (in_RDI->field_1).m[1][3] = dVar34 * dVar10 + dVar17 * dVar7 + dVar19 * dVar21;
  (in_RDI->field_1).m[2][0] = dVar29 * dVar6 + dVar22 * dVar11 + -dVar1 * dVar24;
  (in_RDI->field_1).m[2][1] = -(dVar10 * dVar29 + dVar7 * dVar22 + dVar24 * dVar30);
  (in_RDI->field_1).m[2][2] = dVar10 * dVar33 + dVar25 * dVar7 + dVar2 * dVar30;
  auVar15._8_4_ = SUB84(dStack_120,0);
  auVar15._0_8_ = -(dVar5 + (dVar23 * dVar7 - dVar21 * dVar8));
  auVar15._12_4_ = (uint)((ulong)dStack_120 >> 0x20) ^ 0x80000000;
  *(undefined1 (*) [16])((long)&in_RDI->field_1 + 0x58) = auVar15;
  (in_RDI->field_1).m[3][1] = dVar29 * dVar9 + dVar26 * dVar7 + dVar32 * dVar30;
  (in_RDI->field_1).m[3][2] = -(dVar33 * dVar9 + dVar27 * dVar7 + dVar3 * dVar30);
  (in_RDI->field_1).m[3][3] = dVar9 * dVar28 + dVar31 * dVar7 + dVar34 * dVar30;
  return in_RDI;
}

Assistant:

Matrix4 Matrix4::adjoint() const
        {
            return Matrix4( MINOR( *this, 1, 2, 3, 1, 2, 3 ),
                            -MINOR( *this, 0, 2, 3, 1, 2, 3 ),
                            MINOR( *this, 0, 1, 3, 1, 2, 3 ),
                            -MINOR( *this, 0, 1, 2, 1, 2, 3 ),

                            -MINOR( *this, 1, 2, 3, 0, 2, 3 ),
                            MINOR( *this, 0, 2, 3, 0, 2, 3 ),
                            -MINOR( *this, 0, 1, 3, 0, 2, 3 ),
                            MINOR( *this, 0, 1, 2, 0, 2, 3 ),

                            MINOR( *this, 1, 2, 3, 0, 1, 3 ),
                            -MINOR( *this, 0, 2, 3, 0, 1, 3 ),
                            MINOR( *this, 0, 1, 3, 0, 1, 3 ),
                            -MINOR( *this, 0, 1, 2, 0, 1, 3 ),

                            -MINOR( *this, 1, 2, 3, 0, 1, 2 ),
                            MINOR( *this, 0, 2, 3, 0, 1, 2 ),
                            -MINOR( *this, 0, 1, 3, 0, 1, 2 ),
                            MINOR( *this, 0, 1, 2, 0, 1, 2 ) );
        }